

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O2

void __thiscall
QNetworkRequestFactory::clearAttribute(QNetworkRequestFactory *this,Attribute attribute)

{
  bool bVar1;
  long in_FS_OFFSET;
  Attribute local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = attribute;
  bVar1 = QHash<QNetworkRequest::Attribute,_QVariant>::contains
                    (&((this->d).d.ptr)->attributes,&local_14);
  if (bVar1) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(&this->d);
    QHash<QNetworkRequest::Attribute,_QVariant>::removeImpl<QNetworkRequest::Attribute>
              (&((this->d).d.ptr)->attributes,&local_14);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkRequestFactory::clearAttribute(QNetworkRequest::Attribute attribute)
{
    if (!d->attributes.contains(attribute))
        return;
    d.detach();
    d->attributes.remove(attribute);
}